

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_info.c
# Opt level: O3

double * inform_local_active_info
                   (int *series,size_t n,size_t m,int b,size_t k,double *ai,inform_error *err)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  _Bool _Var4;
  int iVar5;
  size_t l;
  double *__ptr;
  ulong uVar6;
  ulong uVar7;
  double *__ptr_00;
  void *__ptr_01;
  long lVar8;
  int *piVar9;
  long lVar10;
  size_t sVar11;
  int *piVar12;
  void *pvVar13;
  int *piVar14;
  int iVar15;
  size_t sVar16;
  double dVar17;
  undefined1 auVar18 [16];
  
  _Var4 = check_arguments(series,n,m,b,k,err);
  if (_Var4) {
    return (double *)0x0;
  }
  lVar10 = (m - k) * n;
  __ptr = ai;
  if ((ai != (double *)0x0) || (__ptr = (double *)malloc(lVar10 * 8), __ptr != (double *)0x0)) {
    auVar18._8_4_ = (int)(k >> 0x20);
    auVar18._0_8_ = k;
    auVar18._12_4_ = 0x45300000;
    dVar17 = pow((double)b,
                 (auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
    dVar17 = dVar17 * (double)b;
    uVar6 = (ulong)dVar17;
    uVar6 = (long)(dVar17 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6;
    uVar7 = uVar6 / (ulong)(long)b;
    __ptr_00 = (double *)calloc((long)b + uVar6 + uVar7,4);
    if (__ptr_00 == (double *)0x0) {
      __ptr_00 = __ptr;
      if (ai != (double *)0x0) goto LAB_00157402;
    }
    else {
      __ptr_01 = malloc(lVar10 * 0xc);
      if (__ptr_01 != (void *)0x0) {
        if (n != 0) {
          lVar3 = uVar7 * 4 + uVar6 * 4;
          piVar1 = (int *)((long)__ptr_01 + lVar10 * 4);
          piVar9 = series + k;
          sVar16 = 0;
          piVar12 = piVar1 + lVar10;
          pvVar13 = __ptr_01;
          piVar14 = piVar1;
          do {
            *piVar14 = 0;
            iVar15 = 1;
            if (k != 0) {
              iVar5 = 0;
              sVar11 = 0;
              do {
                iVar15 = iVar15 * b;
                iVar5 = iVar5 * b + series[sVar11];
                sVar11 = sVar11 + 1;
              } while (k != sVar11);
              *piVar14 = iVar5;
            }
            if (k < m) {
              lVar8 = 0;
              while( true ) {
                iVar5 = piVar9[lVar8];
                piVar12[lVar8] = iVar5;
                iVar5 = piVar14[lVar8] * b + iVar5;
                *(int *)((long)pvVar13 + lVar8 * 4) = iVar5;
                piVar2 = (int *)((long)__ptr_00 + (long)iVar5 * 4);
                *piVar2 = *piVar2 + 1;
                piVar2 = (int *)((long)__ptr_00 + (long)piVar14[lVar8] * 4 + uVar6 * 4);
                *piVar2 = *piVar2 + 1;
                piVar2 = (int *)((long)__ptr_00 + (long)piVar12[lVar8] * 4 + lVar3);
                *piVar2 = *piVar2 + 1;
                if (~k + m == lVar8) break;
                piVar14[lVar8 + 1] = iVar5 - series[lVar8] * iVar15;
                lVar8 = lVar8 + 1;
              }
            }
            piVar14 = piVar14 + (m - k);
            sVar16 = sVar16 + 1;
            series = series + m;
            piVar9 = piVar9 + m;
            pvVar13 = (void *)((long)pvVar13 + m * 4 + k * -4);
            piVar12 = piVar12 + (m - k);
          } while (sVar16 != n);
          if (lVar10 != 0) {
            lVar8 = 0;
            do {
              dVar17 = log2(((double)*(uint *)((long)__ptr_00 +
                                              (long)*(int *)((long)__ptr_01 + lVar8 * 4) * 4) *
                            (((double)CONCAT44(0x45300000,(int)((ulong)lVar10 >> 0x20)) -
                             1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0))) /
                            ((double)*(uint *)((long)__ptr_00 +
                                              (long)(piVar1 + lVar10)[lVar8] * 4 + lVar3) *
                            (double)*(uint *)((long)__ptr_00 + (long)piVar1[lVar8] * 4 + uVar6 * 4))
                           );
              __ptr[lVar8] = dVar17;
              lVar8 = lVar8 + 1;
            } while (lVar10 != lVar8);
          }
        }
        free(__ptr_01);
        free(__ptr_00);
        return __ptr;
      }
      if (ai == (double *)0x0) {
        free(__ptr);
      }
    }
    free(__ptr_00);
  }
LAB_00157402:
  if (err != (inform_error *)0x0) {
    *err = INFORM_ENOMEM;
  }
  return (double *)0x0;
}

Assistant:

double *inform_local_active_info(int const *series, size_t n, size_t m, int b,
    size_t k, double *ai, inform_error *err)
{
    if (check_arguments(series, n, m, b, k, err)) return NULL;

    size_t const N = n * (m - k);

    bool allocate_ai = (ai == NULL);
    if (allocate_ai)
    {
        ai = malloc(N * sizeof(double));
        if (ai == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t const states_size = (size_t) (b*pow((double) b,(double) k));
    size_t const histories_size = states_size / b;
    size_t const futures_size = b;
    size_t const total_size = states_size + histories_size + futures_size;

    uint32_t *histogram_data = calloc(total_size, sizeof(uint32_t));
    if (histogram_data == NULL)
    {
        if (allocate_ai) free(ai);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    inform_dist states    = { histogram_data, states_size, N };
    inform_dist histories = { histogram_data + states_size, histories_size, N };
    inform_dist futures   = { histogram_data + states_size + histories_size, futures_size, N };

    int *state_data = malloc(3 * N * sizeof(int));
    if (state_data == NULL)
    {
        if (allocate_ai) free(ai);
        free(histogram_data);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    int *state   = state_data;
    int *history = state + N;
    int *future  = history + N;

    accumulate_local_observations(series, n, m, b, k, &states, &histories,
        &futures, state, history, future);

    double r, s, t;
    for (size_t i = 0; i < N; ++i)
    {
        r = states.histogram[state[i]];
        s = histories.histogram[history[i]];
        t = futures.histogram[future[i]];
        ai[i] = log2((r * N) / (s * t));
    }

    free(state_data);
    free(histogram_data);

    return ai;
}